

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSynchData::AssignOwnershipToThread
          (CSynchData *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  LONG LVar1;
  _OwnedObjectsListNode *pooln;
  
  if (CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics !=
      OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x6cb);
    fprintf(_stderr,
            "Expression: CObjectType::OwnershipTracked == GetObjectType()->GetOwnershipSemantics(), Description: AssignOwnershipToThread called on a non-ownable CSynchData [this=%p OwnershipSemantics=%u]\n"
            ,this,(ulong)CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->
                         m_eOwnershipSemantics);
  }
  if (this->m_lOwnershipCount < 1) {
    pooln = CSynchCache<CorUnix::_OwnedObjectsListNode>::Get
                      ((CSynchCache<CorUnix::_OwnedObjectsListNode> *)
                       (CPalSynchronizationManager::s_pObjSynchMgr + 0x4d8),pthrCurrent);
    if (pooln == (_OwnedObjectsListNode *)0x0) {
      if (PAL_InitializeChakraCoreCalled != false) {
        return 8;
      }
    }
    else if (PAL_InitializeChakraCoreCalled != false) {
      this->m_dwOwnerPid = gPID;
      this->m_dwOwnerTid = (DWORD)pthrTarget->m_threadId;
      this->m_pOwnerThread = pthrTarget;
      this->m_poolnOwnedObjectListNode = pooln;
      this->m_lOwnershipCount = 1;
      this->m_fAbandoned = false;
      pooln->pPalObjSynchData = this;
      LOCK();
      this->m_lRefCount = this->m_lRefCount + 1;
      UNLOCK();
      CThreadSynchronizationInfo::AddObjectToOwnedList(&pthrTarget->synchronizationInfo,pooln);
      return 0;
    }
  }
  else {
    LVar1 = GetSignalCount(this);
    if (LVar1 != 0) {
      fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x6d4);
      fprintf(_stderr,
              "Expression: 0 == GetSignalCount(), Description: Conflicting OwnershipCount and SignalCount values\n"
             );
    }
    if ((this->m_pOwnerThread != pthrTarget) || (gPID != this->m_dwOwnerPid)) {
      fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x6db);
      fprintf(_stderr,
              "Expression: pthrTarget == m_pOwnerThread && gPID == m_dwOwnerPid, Description: Attempting to assign ownership of CSynchData %p to thread {pid=%#x tid=%#x} while it is currently owned by thread {pid=%#x tid=%#x}\n"
              ,this,(ulong)gPID,pthrTarget->m_threadId,(ulong)this->m_dwOwnerPid,
              this->m_pOwnerThread->m_threadId);
    }
    this->m_lOwnershipCount = this->m_lOwnershipCount + 1;
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0;
    }
  }
  abort();
}

Assistant:

PAL_ERROR CSynchData::AssignOwnershipToThread(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        // Note: when this method is called by ReleaseFirstWaiter there is
        //       a small time window in which both SignalCount and 
        //       OwnershipCount can be greater than zero (which normally
        //       is illegal). Anyway that is fine since ReleaseFirstWaiter 
        //       will restore the value right after, and such situation
        //       takes place while holding synchroniztion locks, so no
        //       other thread/process can access the object.
                
        PAL_ERROR palErr = NO_ERROR;
        
        _ASSERT_MSG(CObjectType::OwnershipTracked ==
                    GetObjectType()->GetOwnershipSemantics(),
                    "AssignOwnershipToThread called on a non-ownable "
                    "CSynchData [this=%p OwnershipSemantics=%u]\n", this,
                    GetObjectType()->GetOwnershipSemantics());
        

        if (0 < m_lOwnershipCount)
        {
            //
            // Object already owned, incrementing ownership count
            //
            _ASSERT_MSG(0 == GetSignalCount(),
                        "Conflicting OwnershipCount and SignalCount values\n");
            
            _ASSERT_MSG(pthrTarget == m_pOwnerThread && gPID == m_dwOwnerPid,
                        "Attempting to assign ownership of CSynchData %p to "
                        "thread {pid=%#x tid=%#x} while it is currently owned "
                        "by thread {pid=%#x tid=%#x}\n", this,
                        gPID, pthrTarget->GetThreadId(),
                        m_dwOwnerPid, m_pOwnerThread->GetThreadId());

            m_lOwnershipCount++;

            TRACE("Incrementing ownership count for object with "
                  "SynchData %p owned by thread %#x [new count=%d]\n",
                  this, pthrTarget->GetThreadId(), m_lOwnershipCount);
        }
        else
        {
            //
            // Acquiring currently not owned object
            //            
            CPalSynchronizationManager * pSynchManager = 
                CPalSynchronizationManager::GetInstance();
            OwnedObjectsListNode * pooln;

            pooln = pSynchManager->CacheGetOwnedObjsListNode(pthrCurrent);
            if (NULL == pooln)
            {
                ERROR("Out of memory while acquiring mutex ownership");                
                // In this case we bail out. It will result in no
                // thread being awakend, which may cause deadlock,
                // but it is anyway better than corrupting the 
                // ownership list
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOTT_exit;
            } 

            TRACE("Assigning ownable object with SynchData %p to "
                  "thread %#x\n",
                  this, pthrTarget->GetThreadId());

            // Set ownership data
            SetOwner(pthrTarget);
            SetOwnershipListNode(pooln);
            SetOwnershipCount(1);
            SetAbandoned(false);

            // Add object to list of owned objs for current thread
            pooln->pPalObjSynchData = this;
            AddRef();
            pthrTarget->synchronizationInfo.AddObjectToOwnedList(pooln);
        }
        
    AOTT_exit:
        return palErr;
    }